

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_36130a::SerialQueueImpl::run(SerialQueueImpl *this)

{
  function<void_()> *__x;
  unique_lock<std::mutex> lock;
  function<void_()> fn;
  unique_lock<std::mutex> local_68;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  while( true ) {
    local_48 = (code *)0x0;
    pcStack_40 = (code *)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_68._M_owns = false;
    local_68._M_device = &this->operationsMutex;
    std::unique_lock<std::mutex>::lock(&local_68);
    local_68._M_owns = true;
    while (__x = (this->operations).
                 super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (this->operations).
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == __x) {
      std::condition_variable::wait((unique_lock *)&this->readyOperationsCondition);
    }
    std::function<void_()>::operator=((function<void_()> *)&local_58,__x);
    std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
              (&this->operations);
    if (local_68._M_owns == true) {
      std::unique_lock<std::mutex>::unlock(&local_68);
    }
    if (local_48 == (code *)0x0) break;
    (*pcStack_40)(&local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  return;
}

Assistant:

void run() {
    while (true) {
      // Get the next operation from the queue.
      std::function<void(void)> fn;
      {
        std::unique_lock<std::mutex> lock(operationsMutex);

        // While the queue is empty, wait for an item.
        while (operations.empty()) {
          readyOperationsCondition.wait(lock);
        }

        fn = operations.front();
        operations.pop_front();
      }

      // If we got a nil function, the queue is shutting down.
      if (!fn)
        break;
      
      // Execute the operation.
      fn();
    }
  }